

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

Float pbrt::CatmullRom(span<const_float> nodes,span<const_float> values,Float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Float FVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  size_t vb;
  size_t va;
  
  va = nodes.n;
  pfVar12 = nodes.ptr;
  vb = values.n;
  pfVar11 = values.ptr;
  if (va == vb) {
    if ((x < *pfVar12) || (pfVar12[va - 1] < x)) {
      FVar16 = 0.0;
    }
    else {
      uVar9 = va - 2;
      if ((long)uVar9 < 1) {
        uVar15 = 0;
      }
      else {
        lVar13 = 1;
        uVar15 = uVar9;
        do {
          uVar14 = uVar15 >> 1;
          uVar15 = ~uVar14 + uVar15;
          lVar8 = uVar14 + 1 + lVar13;
          if (x < pfVar12[(int)uVar14 + (int)lVar13]) {
            uVar15 = uVar14;
            lVar8 = lVar13;
          }
          lVar13 = lVar8;
        } while (0 < (long)uVar15);
        if (lVar13 - 1U < uVar9) {
          uVar9 = lVar13 - 1U;
        }
        uVar15 = 0;
        if (0 < lVar13) {
          uVar15 = uVar9;
        }
      }
      iVar10 = (int)uVar15;
      fVar1 = pfVar12[iVar10];
      fVar2 = pfVar11[iVar10];
      lVar13 = (long)((uVar15 << 0x20) + 0x100000000) >> 0x1e;
      fVar18 = *(float *)((long)pfVar12 + lVar13);
      fVar3 = *(float *)((long)pfVar11 + lVar13);
      fVar17 = fVar18 - fVar1;
      if (iVar10 < 1) {
        fVar18 = fVar3 - fVar2;
      }
      else {
        fVar18 = (fVar17 * (fVar3 - pfVar11[iVar10 - 1U])) / (fVar18 - pfVar12[iVar10 - 1U]);
      }
      uVar9 = (long)((uVar15 << 0x20) + 0x200000000) >> 0x20;
      if (uVar9 < va) {
        auVar19._0_4_ = (fVar17 * (pfVar11[uVar9] - fVar2)) / (pfVar12[uVar9] - fVar1);
        auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
      }
      else {
        auVar19 = ZEXT416((uint)(fVar3 - fVar2));
      }
      fVar17 = (x - fVar1) / fVar17;
      fVar1 = fVar17 * fVar17;
      fVar4 = fVar17 * fVar1;
      auVar7 = vfmsub213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar4),
                               ZEXT416((uint)(fVar1 * 3.0)));
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * 3.0)),ZEXT416((uint)fVar4),
                               SUB6416(ZEXT464(0xc0000000),0));
      auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),
                               ZEXT416((uint)fVar4));
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(auVar7._0_4_ + 1.0)),
                               ZEXT416((uint)(fVar3 * auVar6._0_4_)));
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)(auVar5._0_4_ + fVar17)),auVar6);
      auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 - fVar1)),auVar19,auVar5);
      FVar16 = auVar19._0_4_;
    }
    return FVar16;
  }
  LogFatal<char_const(&)[13],char_const(&)[14],char_const(&)[13],unsigned_long&,char_const(&)[14],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.cpp"
             ,0xb5,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nodes.size()",
             (char (*) [14])"values.size()",(char (*) [13])"nodes.size()",&va,
             (char (*) [14])"values.size()",&vb);
}

Assistant:

Float CatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> values, Float x) {
    CHECK_EQ(nodes.size(), values.size());
    if (!(x >= nodes.front() && x <= nodes.back()))
        return 0;
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    Float x0 = nodes[idx], x1 = nodes[idx + 1];
    Float f0 = values[idx], f1 = values[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;
    if (idx > 0)
        d0 = width * (f1 - values[idx - 1]) / (x1 - nodes[idx - 1]);
    else
        d0 = f1 - f0;

    if (idx + 2 < nodes.size())
        d1 = width * (values[idx + 2] - f0) / (nodes[idx + 2] - x0);
    else
        d1 = f1 - f0;

    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;
    return (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 + (t3 - 2 * t2 + t) * d0 +
           (t3 - t2) * d1;
}